

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

hash_elem * hash_remove(hash *hash,hash_elem *e)

{
  uint32_t uVar1;
  avl_node *node;
  
  uVar1 = (*hash->hash_func)(hash,e);
  node = avl_search(hash->buckets + (int)uVar1,&e->avl,_hash_cmp_wrap);
  if (node != (avl_node *)0x0) {
    avl_remove(hash->buckets + (int)uVar1,node);
  }
  return (hash_elem *)node;
}

Assistant:

struct hash_elem * hash_remove(struct hash *hash, struct hash_elem *e)
{
    int bucket = hash->hash_func(hash, e);
    struct hash_elem *hash_elem;

    IFDEF_LOCK( spin_lock(hash->locks + bucket) );

#ifdef _HASH_TREE
    struct avl_node *node;
    node = avl_search(hash->buckets + bucket, &e->avl, _hash_cmp_wrap);
    if (node) {
        avl_remove(hash->buckets + bucket, node);
        IFDEF_LOCK( spin_unlock(hash->locks + bucket) );
        hash_elem = _get_entry(node, struct hash_elem, avl);
        return hash_elem;
    }

#else
    struct list_elem *le;
    le = list_begin(hash->buckets + bucket);
    while(le) {
        hash_elem = _get_entry(le, struct hash_elem, list_elem);
        if (!hash->cmp(e, hash_elem)) {
            list_remove(hash->buckets + bucket, le);

            IFDEF_LOCK( spin_unlock(hash->locks + bucket) );

            return hash_elem;
        }
        le = list_next(le);
    }
#endif

    IFDEF_LOCK( spin_unlock(hash->locks + bucket) );

    return NULL;
}